

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

char * __thiscall
Assimp::FBX::FBXConverter::NameTransformationCompProperty
          (FBXConverter *this,TransformationComp comp)

{
  TransformationComp comp_local;
  FBXConverter *this_local;
  
  switch(comp) {
  case TransformationComp_GeometricScalingInverse:
    this_local = (FBXConverter *)anon_var_dwarf_19e942;
    break;
  case TransformationComp_GeometricRotationInverse:
    this_local = (FBXConverter *)anon_var_dwarf_19e959;
    break;
  case TransformationComp_GeometricTranslationInverse:
    this_local = (FBXConverter *)anon_var_dwarf_19e970;
    break;
  case TransformationComp_Translation:
    this_local = (FBXConverter *)anon_var_dwarf_19e99e;
    break;
  case TransformationComp_RotationOffset:
    this_local = (FBXConverter *)anon_var_dwarf_19e85f;
    break;
  case TransformationComp_RotationPivot:
    this_local = (FBXConverter *)anon_var_dwarf_19e876;
    break;
  case TransformationComp_PreRotation:
    this_local = (FBXConverter *)anon_var_dwarf_19e88d;
    break;
  case TransformationComp_Rotation:
    this_local = (FBXConverter *)anon_var_dwarf_19e9b5;
    break;
  case TransformationComp_PostRotation:
    this_local = (FBXConverter *)anon_var_dwarf_19e8a3;
    break;
  case TransformationComp_RotationPivotInverse:
    this_local = (FBXConverter *)0x2c3e50;
    break;
  case TransformationComp_ScalingOffset:
    this_local = (FBXConverter *)anon_var_dwarf_19e8d1;
    break;
  case TransformationComp_ScalingPivot:
    this_local = (FBXConverter *)anon_var_dwarf_19e8dc;
    break;
  case TransformationComp_Scaling:
    this_local = (FBXConverter *)anon_var_dwarf_19e9c0;
    break;
  case TransformationComp_ScalingPivotInverse:
    this_local = (FBXConverter *)0x2c3e80;
    break;
  case TransformationComp_GeometricTranslation:
    this_local = (FBXConverter *)anon_var_dwarf_19e937;
    break;
  case TransformationComp_GeometricRotation:
    this_local = (FBXConverter *)anon_var_dwarf_19e920;
    break;
  case TransformationComp_GeometricScaling:
    this_local = (FBXConverter *)anon_var_dwarf_19e909;
    break;
  case TransformationComp_MAXIMUM:
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/assimp/code/FBX/FBXConverter.cpp"
                  ,0x219,
                  "const char *Assimp::FBX::FBXConverter::NameTransformationCompProperty(TransformationComp)"
                 );
  }
  return (char *)this_local;
}

Assistant:

const char* FBXConverter::NameTransformationCompProperty(TransformationComp comp) {
            switch (comp) {
            case TransformationComp_Translation:
                return "Lcl Translation";
            case TransformationComp_RotationOffset:
                return "RotationOffset";
            case TransformationComp_RotationPivot:
                return "RotationPivot";
            case TransformationComp_PreRotation:
                return "PreRotation";
            case TransformationComp_Rotation:
                return "Lcl Rotation";
            case TransformationComp_PostRotation:
                return "PostRotation";
            case TransformationComp_RotationPivotInverse:
                return "RotationPivotInverse";
            case TransformationComp_ScalingOffset:
                return "ScalingOffset";
            case TransformationComp_ScalingPivot:
                return "ScalingPivot";
            case TransformationComp_Scaling:
                return "Lcl Scaling";
            case TransformationComp_ScalingPivotInverse:
                return "ScalingPivotInverse";
            case TransformationComp_GeometricScaling:
                return "GeometricScaling";
            case TransformationComp_GeometricRotation:
                return "GeometricRotation";
            case TransformationComp_GeometricTranslation:
                return "GeometricTranslation";
            case TransformationComp_GeometricScalingInverse:
                return "GeometricScalingInverse";
            case TransformationComp_GeometricRotationInverse:
                return "GeometricRotationInverse";
            case TransformationComp_GeometricTranslationInverse:
                return "GeometricTranslationInverse";
            case TransformationComp_MAXIMUM: // this is to silence compiler warnings
                break;
            }

            ai_assert(false);

            return nullptr;
        }